

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.h
# Opt level: O1

void __thiscall Graph<Node>::currCC(Graph<Node> *this,vector<int> *cc,vector<bool> *used,int *node)

{
  int iVar1;
  undefined8 in_RAX;
  NodeList<Node> *pNVar2;
  long lVar3;
  int nxtNode;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  if (cc->_capacity <= cc->_size) {
    vector<int>::realloc(cc,(void *)(ulong)(uint)(cc->_capacity * 2),(size_t)used);
  }
  iVar1 = cc->_size;
  cc->_size = iVar1 + 1;
  cc->vect[iVar1] = *node;
  iVar1 = *node;
  used->vect[iVar1] = true;
  pNVar2 = (this->G).vect;
  if (0 < pNVar2[iVar1].nodes._size) {
    pNVar2 = pNVar2 + iVar1;
    lVar3 = 0;
    do {
      iVar1 = (pNVar2->nodes).vect[lVar3]._index;
      uStack_38 = CONCAT44(iVar1,(undefined4)uStack_38);
      if (used->vect[iVar1] == false) {
        currCC(this,cc,used,(int *)((long)&uStack_38 + 4));
      }
      lVar3 = lVar3 + 1;
      pNVar2 = (this->G).vect + *node;
    } while (lVar3 < (pNVar2->nodes)._size);
  }
  return;
}

Assistant:

void currCC(vector <int> &cc, vector <bool> &used, const int &node) {
        cc.push_back(node);
        used[node] = true;

        for (int nxtInd = 0; nxtInd < G[node].size(); ++nxtInd) {
            int nxtNode = G[node][nxtInd].getIndex();

            if (!used[nxtNode]) {
                currCC(cc, used, nxtNode);
            }
        }
    }